

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>
                  *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->b).d);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
                     *)this);
  return;
}

Assistant:

~QStringBuilder() = default;